

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pvip_node.c
# Opt level: O2

PVIPNode *
PVIP_node_new_intf(PVIPParserContext *parser,PVIP_node_type_t type,char *str,size_t len,int base)

{
  char *__nptr;
  size_t sVar1;
  longlong n;
  PVIPNode *pPVar2;
  char *pcVar3;
  
  __nptr = (char *)malloc(len + 1);
  pcVar3 = __nptr;
  for (sVar1 = 0; len != sVar1; sVar1 = sVar1 + 1) {
    if (str[sVar1] != '_') {
      *pcVar3 = str[sVar1];
      pcVar3 = pcVar3 + 1;
    }
  }
  *pcVar3 = '\0';
  n = strtoll(__nptr,(char **)0x0,base);
  free(__nptr);
  pPVar2 = PVIP_node_new_int(parser,type,n);
  return pPVar2;
}

Assistant:

PVIPNode * PVIP_node_new_intf(PVIPParserContext* parser, PVIP_node_type_t type, const char *str, size_t len, int base) {
    char * buf = malloc(len+1);
    char *bufp = buf;
    int i;
    for (i=0; i<len; i++) {
        if (str[i] != '_') {
            *bufp++ = str[i];
        }
    }
    *bufp++ = '\0';
    int64_t n = strtoll(buf, NULL, base);
    free(buf);
    return PVIP_node_new_int(parser, type, n);
}